

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QGraphicsItem_*>::reserve(QList<QGraphicsItem_*> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<QGraphicsItem_*> *pQVar3;
  qsizetype qVar4;
  QGraphicsItem **b;
  Data *pDVar5;
  long in_RSI;
  QArrayDataPointer<QGraphicsItem_*> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QGraphicsItem_*> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QGraphicsItem_*> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QGraphicsItem_*> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QPodArrayOps<QGraphicsItem_*> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QGraphicsItem_*> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QArrayDataPointer<QGraphicsItem_*> *)capacity((QList<QGraphicsItem_*> *)0xa008cf);
  qVar4 = QArrayDataPointer<QGraphicsItem_*>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar3 - qVar4) {
    QArrayDataPointer<QGraphicsItem_*>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QGraphicsItem_*>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_00a00a72;
    QArrayDataPointer<QGraphicsItem_*>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QGraphicsItem_*>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QGraphicsItem_*>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QGraphicsItem_*>::setFlag
                ((QArrayDataPointer<QGraphicsItem_*> *)0xa00976,(ArrayOptions)f.i);
      goto LAB_00a00a72;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QGraphicsItem_*> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QGraphicsItem_*>::QArrayDataPointer
            (pQVar3,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar3 = (QArrayDataPointer<QGraphicsItem_*> *)
           QArrayDataPointer<QGraphicsItem_*>::operator->(&local_38);
  QArrayDataPointer<QGraphicsItem_*>::operator->(in_RDI);
  b = QArrayDataPointer<QGraphicsItem_*>::begin((QArrayDataPointer<QGraphicsItem_*> *)0xa009f6);
  QArrayDataPointer<QGraphicsItem_*>::operator->(in_RDI);
  QArrayDataPointer<QGraphicsItem_*>::end(pQVar3);
  QtPrivate::QPodArrayOps<QGraphicsItem_*>::copyAppend
            (in_stack_ffffffffffffff90,b,(QGraphicsItem **)pQVar3);
  pDVar5 = QArrayDataPointer<QGraphicsItem_*>::d_ptr(&local_38);
  if (pDVar5 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QGraphicsItem_*> *)
         QArrayDataPointer<QGraphicsItem_*>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar3,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QGraphicsItem_*>::setFlag
              ((QArrayDataPointer<QGraphicsItem_*> *)0xa00a59,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QGraphicsItem_*>::swap(pQVar3,in_stack_ffffffffffffff78);
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(pQVar3);
LAB_00a00a72:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}